

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O2

void __thiscall helics::udp::UdpComms::queue_rx_function(UdpComms *this)

{
  InterfaceNetworks IVar1;
  int32_t iVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  size_t size;
  undefined8 in_RCX;
  undefined6 uVar6;
  int __oflag;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  string_view message;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string local_2a0;
  vector<char,_std::allocator<char>_> data;
  error_code error;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  error_code ignored_error;
  ActionMessage cmd;
  endpoint remote_endp;
  const_buffers_1 local_150;
  ActionMessage reply;
  socket socket;
  
  if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
    iVar5 = std::future<int>::get(&this->futurePort);
    LOCK();
    (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar5;
    UNLOCK();
  }
  if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
    CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
    return;
  }
  cmd._0_8_ = &cmd.dest_id;
  cmd.source_id.gid = 0;
  cmd.source_handle.hid = 0;
  cmd._16_8_ = cmd._16_8_ & 0xffffffffffffff00;
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)&ioctx,(string *)&cmd);
  std::__cxx11::string::~string((string *)&cmd);
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::basic_socket<asio::io_context>
            (&socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,
             ((ioctx.
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ictx)._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,0);
  cmd.messageAction =
       (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) * 8
       + cmd_user_disconnect;
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::open
            (&socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(char *)&cmd,__oflag);
  bVar3 = false;
  uVar7 = extraout_RDX;
  while (!bVar3) {
    IVar1 = (this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork;
    uVar6 = (undefined6)((ulong)in_RCX >> 0x10);
    in_RCX = CONCAT62(uVar6,2);
    if (IVar1 == IPV6) {
      in_RCX = CONCAT62(uVar6,10);
    }
    cmd.counter = 0;
    cmd.flags = 0;
    cmd.dest_id.gid = 0;
    cmd.dest_handle.hid = 0;
    cmd.source_id.gid = 0;
    cmd.source_handle.hid = 0;
    uVar4 = (ushort)(this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
    cmd.messageAction._2_2_ = uVar4 << 8 | uVar4 >> 8;
    cmd.messageAction._0_2_ = (short)in_RCX;
    cmd.messageID = 0;
    ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::bind
              (&socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(int)&cmd,
               (sockaddr *)CONCAT71((int7)((ulong)uVar7 >> 8),IVar1),(socklen_t)in_RCX);
    uVar7 = extraout_RDX_00;
    bVar3 = true;
  }
  std::vector<char,_std::allocator<char>_>::vector(&data,0x27d0,(allocator_type *)&cmd);
  remote_endp.impl_.data_._8_1_ = '\0';
  remote_endp.impl_.data_._9_1_ = '\0';
  remote_endp.impl_.data_._10_1_ = '\0';
  remote_endp.impl_.data_._11_1_ = '\0';
  remote_endp.impl_.data_._12_1_ = '\0';
  remote_endp.impl_.data_._13_1_ = '\0';
  remote_endp.impl_.data_._14_1_ = '\0';
  remote_endp.impl_.data_._15_1_ = '\0';
  remote_endp.impl_.data_._16_8_ = 0;
  remote_endp.impl_.data_.v6.sin6_scope_id = 0;
  remote_endp.impl_.data_._0_8_ = 2;
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  ignored_error._M_value = 0;
  ignored_error._M_cat = error._M_cat;
  CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
  do {
    while( true ) {
      cmd._8_8_ = (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
      cmd._0_8_ = (pointer)0x0;
      if (cmd._8_8_ != 0) {
        cmd._0_8_ = data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      size = ::asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
             receive_from<asio::mutable_buffers_1>
                       (&socket,(mutable_buffers_1 *)&cmd,&remote_endp,0,&error);
      if (error._M_value != 0) {
        CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
        goto LAB_0024c446;
      }
      if ((size == 5) &&
         (__x._M_str = data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start, __x._M_len = 5, __y._M_str = "close",
         __y._M_len = 5, bVar3 = std::operator==(__x,__y), bVar3)) goto LAB_0024c433;
      ActionMessage::ActionMessage
                (&cmd,data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,size);
      if ((cmd.messageAction == cmd_protocol_priority) ||
         ((cmd.messageAction == cmd_protocol || (cmd.messageAction == cmd_protocol_big)))) break;
      if (cmd.messageAction == cmd_invalid) {
        message._M_str = "invalid command received udp";
        message._M_len = 0x1c;
        CommsInterface::logWarning((CommsInterface *)this,message);
      }
      else {
        std::function<void_(helics::ActionMessage_&&)>::operator()
                  (&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback,&cmd);
      }
LAB_0024c3f0:
      ActionMessage::~ActionMessage(&cmd);
    }
    if (cmd.messageID == 0x16570bf) {
      ActionMessage::~ActionMessage(&cmd);
      goto LAB_0024c433;
    }
    NetworkCommsInterface::generateReplyToIncomingMessage
              (&reply,&this->super_NetworkCommsInterface,&cmd);
    iVar2 = reply.messageID;
    iVar5 = 7;
    if ((reply.messageID != 0x9db) && (iVar5 = 0, reply.messageAction != cmd_ignore)) {
      ActionMessage::to_string_abi_cxx11_(&local_2a0,&reply);
      local_150.super_const_buffer.data_ = local_2a0._M_dataplus._M_p;
      local_150.super_const_buffer.size_ = local_2a0._M_string_length;
      ::asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
      send_to<asio::const_buffers_1>(&socket,&local_150,&remote_endp,0,&ignored_error);
      std::__cxx11::string::~string((string *)&local_2a0);
    }
    ActionMessage::~ActionMessage(&reply);
    if (iVar2 != 0x9db) goto LAB_0024c3f0;
    ActionMessage::~ActionMessage(&cmd);
  } while ((iVar5 == 0) || (iVar5 == 6));
  if (iVar5 == 7) {
LAB_0024c433:
    LOCK();
    (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
    UNLOCK();
    CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
  }
LAB_0024c446:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&data.super__Vector_base<char,_std::allocator<char>_>);
  ::asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
                   *)&socket);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &ioctx.
              super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void UdpComms::queue_rx_function()
{
    using gmlc::networking::makePortAddress;

    if (PortNumber < 0) {
        PortNumber = futurePort.get();
    }
    if (PortNumber < 0) {
        setRxStatus(ConnectionStatus::ERRORED);
        return;
    }
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    udp::socket socket(ioctx->getBaseContext());
    socket.open(udpnet(interfaceNetwork));
    std::chrono::milliseconds t_cnt{0};
    bool bindsuccess = false;
    while (!bindsuccess) {
        try {
            socket.bind(udp::endpoint(udpnet(interfaceNetwork), static_cast<uint16_t>(PortNumber)));
            bindsuccess = true;
        }
        catch (const std::system_error& error) {
            if ((autoPortNumber) &&
                (hasBroker)) {  // If we failed and we are on an automatically assigned port
                                // number,  just try a different port
                int tries = 0;
                while (!bindsuccess) {
                    ++PortNumber;
                    try {
                        socket.bind(udp::endpoint(udpnet(interfaceNetwork),
                                                  static_cast<uint16_t>(PortNumber)));
                        bindsuccess = true;
                    }
                    catch (const std::system_error&) {
                        ++tries;
                        if (tries > 10) {
                            break;
                        }
                    }
                }
                if (!bindsuccess) {
                    disconnecting = true;
                    logError(fmt::format("unable to bind socket {} :{}",
                                         makePortAddress(localTargetAddress, PortNumber),
                                         error.what()));
                    socket.close();
                    setRxStatus(ConnectionStatus::ERRORED);
                    return;
                }
                continue;
            }
            if (t_cnt == std::chrono::milliseconds(0)) {
                logWarning(fmt::format("bind error on UDP socket {} :{}",
                                       makePortAddress(localTargetAddress, PortNumber),
                                       error.what()));
            }
            std::this_thread::sleep_for(std::chrono::milliseconds(200));
            t_cnt += std::chrono::milliseconds(200);
            if (t_cnt > connectionTimeout) {
                disconnecting = true;
                logError(fmt::format("unable to bind socket {} :{}",
                                     makePortAddress(localTargetAddress, PortNumber),
                                     error.what()));
                socket.close();
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
    }

    std::vector<char> data(10192);
    udp::endpoint remote_endp;
    std::error_code error;
    std::error_code ignored_error;
    setRxStatus(ConnectionStatus::CONNECTED);
    while (true) {
        auto len = socket.receive_from(asio::buffer(data), remote_endp, 0, error);
        if (error) {
            setRxStatus(ConnectionStatus::ERRORED);
            return;
        }
        if (len == 5) {
            const std::string_view str(data.data(), len);
            if (str == "close") {
                break;
            }
        }
        ActionMessage cmd(reinterpret_cast<std::byte*>(data.data()), len);
        if (!isValidCommand(cmd)) {
            logWarning("invalid command received udp");
            continue;
        }
        if (isProtocolCommand(cmd)) {
            if (cmd.messageID == CLOSE_RECEIVER) {
                break;
            }
            auto reply = generateReplyToIncomingMessage(cmd);
            if (reply.messageID == DISCONNECT) {
                break;
            }
            if (reply.action() != CMD_IGNORE) {
                socket.send_to(asio::buffer(reply.to_string()), remote_endp, 0, ignored_error);
            }
        } else {
            ActionCallback(std::move(cmd));
        }
    }
    disconnecting = true;
    setRxStatus(ConnectionStatus::TERMINATED);
}